

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_MacProjector.cpp
# Opt level: O0

void __thiscall
Hydro::MacProjector::getFluxes
          (MacProjector *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *a_sol,
          Location a_loc)

{
  pointer paVar1;
  bool bVar2;
  int *piVar3;
  MultiFab *pMVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *in_RDI;
  value_type *mfp;
  const_iterator __end3;
  const_iterator __begin3;
  array<amrex::MultiFab_*,_3UL> *__range3;
  array<amrex::MultiFab_*,_3UL> *mfarr;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
  *__range2;
  int ilev;
  BoxArray *in_stack_ffffffffffffffa0;
  BoxArray *local_50;
  __normal_iterator<const_std::array<amrex::MultiFab_*,_3UL>_*,_std::vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>_>
  local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined4 local_1c;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = 0;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  piVar3 = amrex::Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0,
                      (size_type)in_RDI);
  if (*piVar3 != 0) {
    paVar1 = in_RDI[3].
             super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    (**(code **)((long)&(paVar1->_M_elems[0]->super_FabArray<amrex::FArrayBox>).super_FabArrayBase +
                0x18))(paVar1,local_20,0,0,0);
  }
  paVar1 = in_RDI[3].
           super__Vector_base<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (*(code *)*(pointer *)
             ((long)&(paVar1->_M_elems[0]->super_FabArray<amrex::FArrayBox>).m_fabs_v + 8))
            (paVar1,local_10,local_18,local_1c);
  bVar2 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<amrex::MLPoisson,_std::default_delete<amrex::MLPoisson>_> *)
                     0x74e336);
  if (bVar2) {
    local_28 = local_10;
    local_30._M_current =
         (array<amrex::MultiFab_*,_3UL> *)
         std::
         vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
         ::begin(in_RDI);
    std::
    vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
    ::end(in_RDI);
    while (bVar2 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_std::array<amrex::MultiFab_*,_3UL>_*,_std::vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>_>
                               *)in_stack_ffffffffffffffa0,
                              (__normal_iterator<const_std::array<amrex::MultiFab_*,_3UL>_*,_std::vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>_>
                               *)in_RDI), bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::array<amrex::MultiFab_*,_3UL>_*,_std::vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>_>
      ::operator*(&local_30);
      local_50 = (BoxArray *)
                 std::array<amrex::MultiFab_*,_3UL>::begin
                           ((array<amrex::MultiFab_*,_3UL> *)0x74e3a2);
      pMVar4 = (MultiFab *)
               std::array<amrex::MultiFab_*,_3UL>::end((array<amrex::MultiFab_*,_3UL> *)0x74e3b1);
      for (; local_50 != (BoxArray *)pMVar4;
          local_50 = &(((FabArray<amrex::FArrayBox> *)&local_50->m_bat)->super_FabArrayBase).
                      boxarray) {
        in_stack_ffffffffffffffa0 = local_50;
        amrex::MultiFab::mult((MultiFab *)local_50,(Real)in_RDI,0);
      }
      __gnu_cxx::
      __normal_iterator<const_std::array<amrex::MultiFab_*,_3UL>_*,_std::vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>_>
      ::operator++(&local_30);
    }
  }
  return;
}

Assistant:

void
MacProjector::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                         const Vector<MultiFab*>& a_sol, MLMG::Location a_loc) const
{
    int ilev = 0;
    if (m_needs_level_bcs[ilev])
        m_linop->setLevelBC(ilev, nullptr);

    m_linop->getFluxes(a_flux, a_sol, a_loc);
    if (m_poisson) {
        for (auto const& mfarr : a_flux) {
            for (auto const& mfp : mfarr) {
                mfp->mult(m_const_beta);
            }
        }
    }
}